

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 04_waypoints_online.cpp
# Opt level: O0

int main(void)

{
  double dVar1;
  initializer_list<std::array<double,_3UL>_> __l;
  Result RVar2;
  ostream *poVar3;
  undefined1 in_CL;
  string local_1f18;
  undefined8 local_1ef8;
  double calculation_duration;
  undefined8 local_1ee8;
  undefined8 uStack_1ee0;
  undefined8 local_1ed8;
  undefined8 local_1ec8;
  undefined8 uStack_1ec0;
  undefined8 local_1eb8;
  undefined8 local_1ea8;
  undefined8 uStack_1ea0;
  undefined8 local_1e98;
  undefined8 local_1e88;
  undefined8 uStack_1e80;
  undefined8 local_1e78;
  undefined8 local_1e68;
  undefined8 uStack_1e60;
  undefined8 local_1e58;
  undefined8 local_1e48;
  undefined8 uStack_1e40;
  undefined8 local_1e38;
  array<double,_3UL> local_1e28;
  undefined8 uStack_1e10;
  undefined8 local_1e08;
  undefined8 uStack_1e00;
  undefined8 local_1df8;
  undefined8 uStack_1df0;
  undefined8 local_1de8;
  undefined8 uStack_1de0;
  undefined8 local_1dd8;
  undefined8 uStack_1dd0;
  iterator local_1dc8;
  undefined8 local_1dc0;
  undefined8 local_1db8;
  undefined8 uStack_1db0;
  undefined8 local_1da8;
  undefined8 local_1d98;
  undefined8 uStack_1d90;
  undefined8 local_1d88;
  undefined8 local_1d78;
  undefined8 uStack_1d70;
  undefined8 local_1d68;
  undefined1 local_1d60 [8];
  OutputParameter<3UL,_ruckig::StandardVector> output;
  undefined1 local_1c08 [8];
  InputParameter<3UL,_ruckig::StandardVector> input;
  Ruckig<3UL,_ruckig::StandardVector,_false> otg;
  size_t max_number_of_waypoints;
  size_t DOFs;
  double control_cycle;
  
  ruckig::Ruckig<3UL,_ruckig::StandardVector,_false>::Ruckig<3UL,_0>
            ((Ruckig<3UL,_ruckig::StandardVector,_false> *)
             &input.interrupt_calculation_duration.super__Optional_base<double,_true,_true>.
              _M_payload.super__Optional_payload_base<double>._M_engaged,0.01,10);
  ruckig::InputParameter<3UL,_ruckig::StandardVector>::InputParameter<3UL,_0>
            ((InputParameter<3UL,_ruckig::StandardVector> *)local_1c08);
  ruckig::OutputParameter<3UL,_ruckig::StandardVector>::OutputParameter<3UL,_0>
            ((OutputParameter<3UL,_ruckig::StandardVector> *)local_1d60,10);
  local_1d78 = 0x3fc999999999999a;
  uStack_1d70 = 0;
  local_1d68 = 0xbfd3333333333333;
  input.current_position._M_elems[1] = -0.3;
  input.duration_discretization = 0x9999999a;
  input._20_4_ = 0x3fc99999;
  input.current_position._M_elems[0] = 0.0;
  local_1d98 = 0;
  uStack_1d90 = 0x3fc999999999999a;
  local_1d88 = 0;
  input.current_velocity._M_elems[1] = 0.0;
  input.current_position._M_elems[2] = 0.0;
  input.current_velocity._M_elems[0] = 0.2;
  local_1db8 = 0;
  uStack_1db0 = 0x3fe3333333333333;
  local_1da8 = 0;
  input.current_acceleration._M_elems[1] = 0.0;
  input.current_velocity._M_elems[2] = 0.0;
  input.current_acceleration._M_elems[0] = 0.6;
  local_1dd8 = 0x3ffccccccccccccd;
  uStack_1dd0 = 0xbfb999999999999a;
  local_1de8 = 0;
  uStack_1de0 = 0x3fe999999999999a;
  local_1df8 = 0xbfd999999999999a;
  uStack_1df0 = 0xbfd6666666666666;
  local_1e08 = 0xbfe0000000000000;
  uStack_1e00 = 0x3fd999999999999a;
  local_1e28._M_elems[2] = 1.0;
  uStack_1e10 = 0xbfe3333333333333;
  local_1e28._M_elems[0] = 1.4;
  local_1e28._M_elems[1] = -1.6;
  local_1dc8 = &local_1e28;
  local_1dc0 = 4;
  __l._M_len = 4;
  __l._M_array = local_1dc8;
  std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::operator=
            ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
             &input.min_acceleration.super__Optional_base<std::array<double,_3UL>,_true,_true>.
              _M_payload.super__Optional_payload_base<std::array<double,_3UL>_>._M_engaged,__l);
  local_1e48 = 0x3fe0000000000000;
  uStack_1e40 = 0x3ff0000000000000;
  local_1e38 = 0;
  input.target_position._M_elems[1] = 0.0;
  input.current_acceleration._M_elems[2] = 0.5;
  input.target_position._M_elems[0] = 1.0;
  local_1e58 = 0x3fd3333333333333;
  local_1e68 = 0x3fc999999999999a;
  uStack_1e60 = 0;
  input.target_velocity._M_elems[1] = 0.3;
  input.target_position._M_elems[2] = 0.2;
  input.target_velocity._M_elems[0] = 0.0;
  local_1e78 = 0xbfb999999999999a;
  local_1e88 = 0;
  uStack_1e80 = 0x3fb999999999999a;
  input.target_acceleration._M_elems[1] = -0.1;
  input.target_velocity._M_elems[2] = 0.0;
  input.target_acceleration._M_elems[0] = 0.1;
  local_1e98 = 0x3ff0000000000000;
  local_1ea8 = 0x3ff0000000000000;
  uStack_1ea0 = 0x4000000000000000;
  input.max_velocity._M_elems[1] = 1.0;
  input.target_acceleration._M_elems[2] = 1.0;
  input.max_velocity._M_elems[0] = 2.0;
  local_1eb8 = 0x4000000000000000;
  local_1ec8 = 0x4008000000000000;
  uStack_1ec0 = 0x4000000000000000;
  input.max_acceleration._M_elems[1] = 2.0;
  input.max_velocity._M_elems[2] = 3.0;
  input.max_acceleration._M_elems[0] = 2.0;
  local_1ed8 = 0x4034000000000000;
  local_1ee8 = 0x4018000000000000;
  uStack_1ee0 = 0x4024000000000000;
  input.max_jerk._M_elems[1] = 20.0;
  input.max_acceleration._M_elems[2] = 6.0;
  input.max_jerk._M_elems[0] = 10.0;
  calculation_duration._4_4_ = 500;
  std::optional<double>::operator=
            ((optional<double> *)
             &input.per_section_minimum_duration.
              super__Optional_base<std::vector<double,_std::allocator<double>_>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::vector<double,_std::allocator<double>_>,_true,_false,_false>
              .super__Optional_payload_base<std::vector<double,_std::allocator<double>_>_>.
              _M_engaged,(int *)((long)&calculation_duration + 4));
  poVar3 = std::operator<<((ostream *)&std::cout,"t | position");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_1ef8 = 0;
  while( true ) {
    RVar2 = ruckig::Ruckig<3UL,_ruckig::StandardVector,_false>::update
                      ((Ruckig<3UL,_ruckig::StandardVector,_false> *)
                       &input.interrupt_calculation_duration.
                        super__Optional_base<double,_true,_true>._M_payload.
                        super__Optional_payload_base<double>._M_engaged,
                       (InputParameter<3UL,_ruckig::StandardVector> *)local_1c08,
                       (OutputParameter<3UL,_ruckig::StandardVector> *)local_1d60);
    if (RVar2 != Working) break;
    if ((output.new_section._1_1_ & 1) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Updated the trajectory:");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"  Reached target position in ");
      dVar1 = ruckig::Trajectory<3UL,_ruckig::StandardVector>::get_duration
                        ((Trajectory<3UL,_ruckig::StandardVector> *)&output);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar1);
      poVar3 = std::operator<<(poVar3," [s].");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"  Calculation in ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(double)output._312_8_);
      poVar3 = std::operator<<(poVar3,anon_var_dwarf_1bc3c);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,output.new_jerk._M_elems[2]);
    poVar3 = std::operator<<(poVar3," | ");
    ruckig::join<std::array<double,3ul>>
              (&local_1f18,(ruckig *)&output.trajectory.degrees_of_freedom,(array<double,_3UL> *)0x0
               ,(bool)in_CL);
    poVar3 = std::operator<<(poVar3,(string *)&local_1f18);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_1f18);
    ruckig::OutputParameter<3UL,_ruckig::StandardVector>::pass_to_input
              ((OutputParameter<3UL,_ruckig::StandardVector> *)local_1d60,
               (InputParameter<3UL,_ruckig::StandardVector> *)local_1c08);
  }
  ruckig::OutputParameter<3UL,_ruckig::StandardVector>::~OutputParameter
            ((OutputParameter<3UL,_ruckig::StandardVector> *)local_1d60);
  ruckig::InputParameter<3UL,_ruckig::StandardVector>::~InputParameter
            ((InputParameter<3UL,_ruckig::StandardVector> *)local_1c08);
  ruckig::Ruckig<3UL,_ruckig::StandardVector,_false>::~Ruckig
            ((Ruckig<3UL,_ruckig::StandardVector,_false> *)
             &input.interrupt_calculation_duration.super__Optional_base<double,_true,_true>.
              _M_payload.super__Optional_payload_base<double>._M_engaged);
  return 0;
}

Assistant:

int main() {
    const double control_cycle = 0.01;
    const size_t DOFs = 3;
    const size_t max_number_of_waypoints = 10;  // for memory allocation

    // Create instances: the Ruckig OTG as well as input and output parameters
    Ruckig<DOFs> otg(control_cycle, max_number_of_waypoints);
    InputParameter<DOFs> input;
    OutputParameter<DOFs> output(max_number_of_waypoints);

    // Set input parameters
    input.current_position = {0.2, 0.0, -0.3};
    input.current_velocity = {0.0, 0.2, 0.0};
    input.current_acceleration = {0.0, 0.6, 0.0};

    input.intermediate_positions = {
        {1.4, -1.6, 1.0},
        {-0.6, -0.5, 0.4},
        {-0.4, -0.35, 0.0},
        {0.8, 1.8, -0.1}
    };

    input.target_position = {0.5, 1.0, 0.0};
    input.target_velocity = {0.2, 0.0, 0.3};
    input.target_acceleration = {0.0, 0.1, -0.1};

    input.max_velocity = {1.0, 2.0, 1.0};
    input.max_acceleration = {3.0, 2.0, 2.0};
    input.max_jerk = {6.0, 10.0, 20.0};

    input.interrupt_calculation_duration = 500; // [µs]

    std::cout << "t | position" << std::endl;
    double calculation_duration = 0.0;
    while (otg.update(input, output) == Result::Working) {
        if (output.new_calculation) {
            std::cout << "Updated the trajectory:" << std::endl;
            std::cout << "  Reached target position in " << output.trajectory.get_duration() << " [s]." << std::endl;
            std::cout << "  Calculation in " << output.calculation_duration << " [µs]." << std::endl;
        }

        std::cout << output.time << " | " << join(output.new_position) << std::endl;

        output.pass_to_input(input);
    }
}